

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O1

int Fra_ClassesRefine1(Fra_Cla_t *p,int fRefineNewClass,int *pSkipped)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  Aig_Obj_t **ppAVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  void **ppvVar8;
  Aig_Obj_t *pAVar9;
  uint uVar10;
  long lVar11;
  
  iVar5 = p->vClasses1->nSize;
  if (iVar5 == 0) {
    return 0;
  }
  if (iVar5 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if ((Aig_Obj_t *)*p->vClasses1->pArray == p->pAig->pConst1) {
    __assert_fail("Vec_PtrEntry(p->vClasses1,0) != Aig_ManConst1(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClass.c"
                  ,0x217,"int Fra_ClassesRefine1(Fra_Cla_t *, int, int *)");
  }
  p->vClassNew->nSize = 0;
  pVVar6 = p->vClasses1;
  iVar5 = pVVar6->nSize;
  if (iVar5 < 1) {
    uVar10 = 0;
  }
  else {
    lVar11 = 0;
    uVar10 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar6->pArray[lVar11];
      iVar5 = (*p->pFuncNodeIsConst)(pAVar2);
      if (iVar5 == 0) {
        pVVar6 = p->vClassNew;
        uVar1 = pVVar6->nCap;
        if (pVVar6->nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar6->pArray,0x80);
            }
            pVVar6->pArray = ppvVar8;
            iVar5 = 0x10;
          }
          else {
            iVar5 = uVar1 * 2;
            if (iVar5 <= (int)uVar1) goto LAB_009017bf;
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
            }
            pVVar6->pArray = ppvVar8;
          }
          pVVar6->nCap = iVar5;
        }
LAB_009017bf:
        iVar5 = pVVar6->nSize;
        pVVar6->nSize = iVar5 + 1;
        ppvVar8 = pVVar6->pArray + iVar5;
      }
      else {
        if (((int)uVar10 < 0) || (p->vClasses1->nSize <= (int)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        uVar7 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        ppvVar8 = p->vClasses1->pArray + uVar7;
      }
      *ppvVar8 = pAVar2;
      lVar11 = lVar11 + 1;
      pVVar6 = p->vClasses1;
      iVar5 = pVVar6->nSize;
    } while (lVar11 < iVar5);
  }
  if (iVar5 < (int)uVar10) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
  }
  pVVar6->nSize = uVar10;
  iVar5 = p->vClassNew->nSize;
  if ((long)iVar5 == 0) {
    return iVar5;
  }
  if (iVar5 == 1) {
    pvVar3 = *p->vClassNew->pArray;
    *(undefined8 *)
     (*(long *)(*(long *)(*(long *)((long)pvVar3 + 0x28) + 0x30) + 8) +
     (long)*(int *)((long)pvVar3 + 0x24) * 8) = 0;
    return 1;
  }
  ppAVar4 = p->pMemClassesFree;
  pVVar6 = p->vClassNew;
  p->pMemClassesFree = ppAVar4 + (long)iVar5 * 2;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar6->pArray[lVar11];
      ppAVar4[lVar11] = pAVar2;
      ppAVar4[p->vClassNew->nSize + lVar11] = (Aig_Obj_t *)0x0;
      if (lVar11 == 0) {
        pAVar9 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar9 = *ppAVar4;
      }
      *(Aig_Obj_t **)
       (*(long *)(*(long *)((long)(pAVar2->field_5).pData + 0x30) + 8) + (long)pAVar2->Id * 8) =
           pAVar9;
      lVar11 = lVar11 + 1;
      pVVar6 = p->vClassNew;
    } while (lVar11 < pVVar6->nSize);
  }
  if (*ppAVar4 == (Aig_Obj_t *)0x0) {
    __assert_fail("ppClass[0] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClass.c"
                  ,0x239,"int Fra_ClassesRefine1(Fra_Cla_t *, int, int *)");
  }
  pVVar6 = p->vClasses;
  uVar10 = pVVar6->nCap;
  if (pVVar6->nSize == uVar10) {
    if ((int)uVar10 < 0x10) {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar6->pArray,0x80);
      }
      pVVar6->pArray = ppvVar8;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar10 * 2;
      if (iVar5 <= (int)uVar10) goto LAB_00901927;
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar10 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar6->pArray,(ulong)uVar10 << 4);
      }
      pVVar6->pArray = ppvVar8;
    }
    pVVar6->nCap = iVar5;
  }
LAB_00901927:
  iVar5 = pVVar6->nSize;
  pVVar6->nSize = iVar5 + 1;
  pVVar6->pArray[iVar5] = ppAVar4;
  if (fRefineNewClass == 0) {
    iVar5 = 1;
    if (pSkipped != (int *)0x0) {
      *pSkipped = *pSkipped + 1;
    }
  }
  else {
    iVar5 = Fra_RefineClassLastIter(p,p->vClasses);
    iVar5 = iVar5 + 1;
  }
  return iVar5;
}

Assistant:

int Fra_ClassesRefine1( Fra_Cla_t * p, int fRefineNewClass, int * pSkipped )
{
    Aig_Obj_t * pObj, ** ppClass;
    int i, k, nRefis = 1;
    // check if there is anything to refine
    if ( Vec_PtrSize(p->vClasses1) == 0 )
        return 0;
    // make sure constant 1 class contains only non-constant nodes
    assert( Vec_PtrEntry(p->vClasses1,0) != Aig_ManConst1(p->pAig) );
    // collect all the nodes to be refined
    k = 0;
    Vec_PtrClear( p->vClassNew );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClasses1, pObj, i )
    {
        if ( p->pFuncNodeIsConst( pObj ) )
            Vec_PtrWriteEntry( p->vClasses1, k++, pObj );
        else 
            Vec_PtrPush( p->vClassNew, pObj );
    }
    Vec_PtrShrink( p->vClasses1, k );
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;
/*
    printf( "Refined const-1 class: {" );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
        printf( " %d", pObj->Id );
    printf( " }\n" );
*/
    if ( Vec_PtrSize(p->vClassNew) == 1 )
    {
        Fra_ClassObjSetRepr( (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,0), NULL );
        return 1;
    }
    // create a new class composed of these nodes
    ppClass = p->pMemClassesFree;
    p->pMemClassesFree += 2 * Vec_PtrSize(p->vClassNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClass[i] = pObj;
        ppClass[Vec_PtrSize(p->vClassNew)+i] = NULL;
        Fra_ClassObjSetRepr( pObj, i? ppClass[0] : NULL );
    }
    assert( ppClass[0] != NULL );
    Vec_PtrPush( p->vClasses, ppClass );
    // iteratively refine this class
    if ( fRefineNewClass )
        nRefis += Fra_RefineClassLastIter( p, p->vClasses );
    else if ( pSkipped )
        (*pSkipped)++;
    return nRefis;
}